

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void C_InitConsole(int width,int height,bool ingame)

{
  int iVar1;
  FConsoleBuffer *this;
  
  vidactive = ingame;
  if (ConFont == (FFont *)0x0) {
    iVar1 = 8;
  }
  else {
    iVar1 = (*ConFont->_vptr_FFont[3])(ConFont,0x4d);
  }
  ConWidth = width + -0x10;
  ConCols = ConWidth / iVar1;
  if (conbuffer == (FConsoleBuffer *)0x0) {
    this = (FConsoleBuffer *)operator_new(0x68);
    FConsoleBuffer::FConsoleBuffer(this);
    conbuffer = this;
  }
  return;
}

Assistant:

void C_InitConsole (int width, int height, bool ingame)
{
	int cwidth, cheight;

	vidactive = ingame;
	if (ConFont != NULL)
	{
		cwidth = ConFont->GetCharWidth ('M');
		cheight = ConFont->GetHeight();
	}
	else
	{
		cwidth = cheight = 8;
	}
	ConWidth = (width - LEFTMARGIN - RIGHTMARGIN);
	ConCols = ConWidth / cwidth;

	if (conbuffer == NULL) conbuffer = new FConsoleBuffer;
}